

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O1

void * compact_thread(void *args)

{
  int iVar1;
  fdb_file_handle *dbfile;
  fdb_file_handle *local_10;
  
  fdb_open(&local_10,"e2edb_main",(fdb_config *)args);
  iVar1 = 3;
  do {
    sleep(2);
    fdb_compact(local_10,(char *)0x0);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fdb_close(local_10);
  return (void *)0x0;
}

Assistant:

void *compact_thread(void *args) {
    int i;
    fdb_config *fconfig = (fdb_config *)args;
    fdb_file_handle *dbfile;
    fdb_open(&dbfile, E2EDB_MAIN, fconfig);
    for (i = 0; i < 3; ++i) {
        sleep(2);
#ifdef __DEBUG_E2E
        printf("compact: %d\n", i);
#endif
        fdb_compact(dbfile, NULL);
    }
    fdb_close(dbfile);
    return NULL;
}